

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QString,QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple_const&>
          (Node<QString,QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  Node<QString,QtInstallDirectoryWithTriple> NVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  Data *local_88;
  QHash<QString,_QString> local_70;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QHash<QString,_QString> local_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  Node<QString,QtInstallDirectoryWithTriple> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (args->qtInstallDirectory).d.d;
  pcVar3 = (args->qtInstallDirectory).d.ptr;
  qVar4 = (args->qtInstallDirectory).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar5 = (args->qtDirectories).d;
  if ((pDVar5 != (Data *)0x0) && ((pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = &((args->triple).d.d)->super_QArrayData;
  pcVar6 = (args->triple).d.ptr;
  qVar7 = (args->triple).d.size;
  if (local_48 == (QArrayData *)0x0) {
    local_88 = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_48)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_48)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_88 = (Data *)local_48;
  }
  NVar1 = (Node<QString,QtInstallDirectoryWithTriple>)args->enabled;
  local_68 = *(QArrayData **)(this + 0x18);
  uStack_60 = *(undefined8 *)(this + 0x20);
  *(Data **)(this + 0x18) = pDVar2;
  *(char16_t **)(this + 0x20) = pcVar3;
  local_58 = *(undefined8 *)(this + 0x28);
  *(qsizetype *)(this + 0x28) = qVar4;
  local_50.d = (Data *)0x0;
  local_70.d = *(Data **)(this + 0x30);
  *(Data **)(this + 0x30) = pDVar5;
  pcStack_40 = pcVar6;
  local_38 = qVar7;
  local_30 = NVar1;
  QHash<QString,_QString>::~QHash(&local_70);
  local_48 = *(QArrayData **)(this + 0x38);
  pcStack_40 = *(char16_t **)(this + 0x40);
  *(Data **)(this + 0x38) = local_88;
  *(char16_t **)(this + 0x40) = pcVar6;
  local_38 = *(qsizetype *)(this + 0x48);
  *(qsizetype *)(this + 0x48) = qVar7;
  this[0x50] = NVar1;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_50);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }